

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

void Assimp::IFC::ProcessExtrudedArea
               (IfcExtrudedAreaSolid *solid,TempMesh *curve,IfcVector3 *extrusionDir,
               TempMesh *result,ConversionData *conv,bool collect_openings)

{
  pointer *ppaVar1;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar2;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __first;
  __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
  __last;
  pointer pTVar3;
  element_type *peVar4;
  double *pdVar5;
  iterator iVar6;
  IfcVector3 *pIVar7;
  _Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter> __comp;
  IfcVector3 __comp_00;
  undefined4 uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar9;
  int iVar10;
  IfcVector3 *v;
  IfcProfileDef *pIVar11;
  IfcAxis2Placement3D *in_00;
  pointer paVar12;
  IfcVector3 *pIVar13;
  ulong uVar14;
  IfcVector3 *pIVar15;
  aiVector3t<double> *paVar16;
  undefined7 in_register_00000089;
  ulong uVar17;
  long lVar18;
  TempMesh *this_01;
  ulong uVar19;
  TempOpening *opening;
  pointer pTVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> in;
  IfcVector3 dir;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> nors;
  shared_ptr<Assimp::IFC::TempMesh> profile2D;
  shared_ptr<Assimp::IFC::TempMesh> profile;
  TempMesh temp;
  IfcMatrix4 trafo;
  IfcVector3 profileNormal;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_250;
  ConversionData *local_238;
  double local_230;
  IfcVector3 local_228;
  undefined8 local_208;
  TempMesh *local_200;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_1f8;
  TempOpening local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_178;
  undefined4 local_16c;
  TempMesh *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  TempMesh *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  TempMesh local_148;
  IfcExtrudedAreaSolid *local_118;
  undefined8 local_110;
  IfcMatrix4 local_108;
  double local_88;
  double dStack_80;
  double local_78;
  IfcExtrudedAreaSolid *local_68;
  double dStack_60;
  double local_58;
  IfcVector3 local_48;
  
  local_238 = conv;
  pIVar11 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                      (*(LazyObject **)
                        &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  iVar10 = std::__cxx11::string::compare
                     (&(pIVar11->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                       field_0x10);
  if (iVar10 == 0) {
    lVar21 = (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(curve->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_110 = CONCAT71((int7)(lVar21 >> 0xb),2 < (ulong)((lVar21 >> 3) * -0x5555555555555555));
  }
  else {
    local_110 = 0;
  }
  if (1e-06 < solid->Depth || solid->Depth == 1e-06) {
    local_16c = (undefined4)CONCAT71(in_register_00000089,collect_openings);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&result->mVerts,
               ((long)(curve->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curve->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 <<
               (char)local_110 + 1);
    local_178 = &result->mVertcnt;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&result->mVertcnt,
               ((long)(curve->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curve->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 2);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
              (&local_250,&curve->mVerts);
    local_108.a1 = 1.0;
    local_108.a2 = 0.0;
    local_108.a3 = 0.0;
    local_108.a4 = 0.0;
    local_108.b1 = 0.0;
    local_108.b2 = 1.0;
    local_108.b3 = 0.0;
    local_108.b4 = 0.0;
    local_108.c1 = 0.0;
    local_108.c2 = 0.0;
    local_108.c3 = 1.0;
    local_108.c4 = 0.0;
    local_108.d1 = 0.0;
    local_108.d2 = 0.0;
    local_108.d3 = 0.0;
    local_108.d4 = 1.0;
    in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      ((solid->super_IfcSweptAreaSolid).Position.obj);
    ConvertAxisPlacement(&local_108,in_00);
    if (local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      dVar24 = -20000000000.0;
      dVar26 = -20000000000.0;
      dVar25 = -20000000000.0;
    }
    else {
      paVar12 = local_250.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      dVar28 = -10000000000.0;
      dVar29 = -10000000000.0;
      dVar30 = 10000000000.0;
      dVar32 = 10000000000.0;
      dVar34 = 10000000000.0;
      dVar27 = -10000000000.0;
      do {
        dVar25 = ((IfcVector3 *)&paVar12->x)->x;
        dVar35 = paVar12->y;
        dVar33 = paVar12->z;
        dVar24 = local_108.a3 * dVar33 + local_108.a1 * dVar25 + local_108.a2 * dVar35 +
                 local_108.a4;
        dVar26 = local_108.b3 * dVar33 + local_108.b1 * dVar25 + local_108.b2 * dVar35 +
                 local_108.b4;
        dVar25 = dVar33 * local_108.c3 + dVar25 * local_108.c1 + dVar35 * local_108.c2 +
                 local_108.c4;
        ((IfcVector3 *)&paVar12->x)->x = dVar24;
        paVar12->y = dVar26;
        paVar12->z = dVar25;
        dVar35 = dVar24;
        if (dVar34 <= dVar24) {
          dVar35 = dVar34;
        }
        dVar33 = dVar26;
        if (dVar32 <= dVar26) {
          dVar33 = dVar32;
        }
        dVar31 = dVar25;
        if (dVar30 <= dVar25) {
          dVar31 = dVar30;
        }
        if (dVar24 <= dVar28) {
          dVar24 = dVar28;
        }
        if (dVar26 <= dVar29) {
          dVar26 = dVar29;
        }
        if (dVar25 <= dVar27) {
          dVar25 = dVar27;
        }
        paVar12 = paVar12 + 1;
        dVar28 = dVar24;
        dVar29 = dVar26;
        dVar30 = dVar31;
        dVar32 = dVar33;
        dVar34 = dVar35;
        dVar27 = dVar25;
      } while (paVar12 !=
               local_250.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish);
      dVar24 = dVar24 - dVar35;
      dVar26 = dVar26 - dVar33;
      dVar25 = dVar25 - dVar31;
    }
    local_230 = dVar25 * dVar25 + dVar24 * dVar24 + dVar26 * dVar26;
    if (local_230 < 0.0) {
      local_230 = sqrt(local_230);
    }
    else {
      local_230 = SQRT(local_230);
    }
    dVar25 = extrusionDir->x;
    dVar24 = extrusionDir->y;
    dVar26 = extrusionDir->z;
    local_228.x = local_108.a3 * dVar26 + local_108.a1 * dVar25 + local_108.a2 * dVar24;
    local_228.y = local_108.b3 * dVar26 + local_108.b1 * dVar25 + local_108.b2 * dVar24;
    local_228.z = dVar26 * local_108.c3 + dVar25 * local_108.c1 + dVar24 * local_108.c2;
    TempMesh::ComputePolygonNormal
              (&local_48,
               local_250.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start,
               ((long)local_250.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_250.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,true);
    if ((local_48.z * local_228.z + local_48.x * local_228.x + local_48.y * local_228.y < 0.0) &&
       (pIVar15 = local_250.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1,
       pIVar7 = local_250.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start,
       local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start < pIVar15 &&
       local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)) {
      do {
        pIVar13 = pIVar7 + 1;
        local_1d8.extrusionDir.y = pIVar7->z;
        local_1d8.solid = (IfcSolidModel *)((IfcVector3 *)&pIVar7->x)->x;
        local_1d8.extrusionDir.x = pIVar7->y;
        pIVar7->z = pIVar15->z;
        dVar25 = pIVar15->y;
        ((IfcVector3 *)&pIVar7->x)->x = ((IfcVector3 *)&pIVar15->x)->x;
        pIVar7->y = dVar25;
        pIVar15->z = local_1d8.extrusionDir.y;
        ((IfcVector3 *)&pIVar15->x)->x = (double)local_1d8.solid;
        pIVar15->y = local_1d8.extrusionDir.x;
        pIVar15 = pIVar15 + -1;
        pIVar7 = pIVar13;
      } while (pIVar13 < pIVar15);
    }
    local_1f8.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (aiVector3t<double> *)0x0;
    local_1f8.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (aiVector3t<double> *)0x0;
    pvVar2 = local_238->apply_openings;
    if (pvVar2 == (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0
       ) {
      bVar23 = false;
    }
    else {
      bVar23 = (pvVar2->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish !=
               (pvVar2->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    local_118 = solid;
    this_01 = result;
    local_200 = result;
    if (bVar23) {
      if (local_238->settings->useCustomTriangulation == false) {
        __first._M_current =
             (pvVar2->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (pvVar2->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_1d8.solid =
             (IfcSolidModel *)
             ((IfcVector3 *)
             &(local_250.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start)->x)->x;
        local_1d8.extrusionDir.x =
             (local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->y;
        local_1d8.extrusionDir.y =
             (local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->z;
        __comp_00.x = (local_250.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
        __comp_00.y = (local_250.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y;
        __comp_00.z = (local_250.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z;
        local_68 = (IfcExtrudedAreaSolid *)local_1d8.solid;
        dStack_60 = local_1d8.extrusionDir.x;
        local_58 = local_1d8.extrusionDir.y;
        if (__first._M_current != __last._M_current) {
          uVar14 = ((long)__last._M_current - (long)__first._M_current >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar21 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                    (__first,__last,(ulong)(((uint)lVar21 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>)__comp_00);
          __comp._M_comp.base.y = local_1d8.extrusionDir.x;
          __comp._M_comp.base.x = (double)local_1d8.solid;
          __comp._M_comp.base.z = local_1d8.extrusionDir.y;
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening*,std::vector<Assimp::IFC::TempOpening,std::allocator<Assimp::IFC::TempOpening>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::TempOpening::DistanceSorter>>
                    (__first,__last,__comp);
        }
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&local_1f8,
                 ((long)(local_238->apply_openings->
                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_238->apply_openings->
                        super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
      local_178 = &local_148.mVertcnt;
      pTVar20 = (local_238->apply_openings->
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (local_238->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      this_01 = &local_148;
      if (pTVar20 != pTVar3) {
        do {
          peVar4 = (pTVar20->profileMesh).
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((ulong)(((long)(peVar4->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar4->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < 3) {
            local_1d8.solid = (IfcSolidModel *)0x0;
            local_1d8.extrusionDir.x = 0.0;
            local_1d8.extrusionDir.y = 0.0;
            if (local_1f8.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_1f8.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_1f8
                         ,(iterator)
                          local_1f8.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (aiVector3t<double> *)&local_1d8);
            }
            else {
              (local_1f8.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = 0.0;
              (local_1f8.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = 0.0;
              (local_1f8.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = 0.0;
LAB_005a419f:
              local_1f8.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_1f8.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            pdVar5 = &((peVar4->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
            dVar26 = pdVar5[6] - *pdVar5;
            dVar28 = pdVar5[7] - pdVar5[1];
            dVar24 = pdVar5[8] - pdVar5[2];
            dVar29 = pdVar5[3] - *pdVar5;
            dVar25 = pdVar5[4] - pdVar5[1];
            dVar27 = pdVar5[5] - pdVar5[2];
            local_1d8.solid = (IfcSolidModel *)(dVar28 * dVar27 - dVar25 * dVar24);
            local_1d8.extrusionDir.x = dVar24 * dVar29 - dVar27 * dVar26;
            local_1d8.extrusionDir.y = dVar25 * dVar26 - dVar29 * dVar28;
            dVar25 = local_1d8.extrusionDir.y * local_1d8.extrusionDir.y +
                     (double)local_1d8.solid * (double)local_1d8.solid +
                     local_1d8.extrusionDir.x * local_1d8.extrusionDir.x;
            if (dVar25 < 0.0) {
              dVar25 = sqrt(dVar25);
            }
            else {
              dVar25 = SQRT(dVar25);
            }
            dVar25 = 1.0 / dVar25;
            local_1d8.solid = (IfcSolidModel *)((double)local_1d8.solid * dVar25);
            local_1d8.extrusionDir.x = local_1d8.extrusionDir.x * dVar25;
            local_1d8.extrusionDir.y = dVar25 * local_1d8.extrusionDir.y;
            if (local_1f8.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                local_1f8.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              (local_1f8.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->z = local_1d8.extrusionDir.y;
              (local_1f8.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = (double)local_1d8.solid;
              (local_1f8.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = local_1d8.extrusionDir.x;
              goto LAB_005a419f;
            }
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&local_1f8,
                       (iterator)
                       local_1f8.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(aiVector3t<double> *)&local_1d8);
          }
          pTVar20 = pTVar20 + 1;
          result = local_200;
        } while (pTVar20 != pTVar3);
      }
    }
    local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((long)local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      local_208 = (ulong)local_208._4_4_ << 0x20;
    }
    else {
      uVar14 = ((long)local_250.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_250.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_230 = local_230 * 0.1;
      lVar21 = 0;
      local_208 = 0;
      uVar19 = 0;
      do {
        uVar19 = uVar19 + 1;
        uVar17 = uVar19;
        if (uVar19 == uVar14) {
          uVar17 = 0;
        }
        local_1d8.solid = (IfcSolidModel *)CONCAT44(local_1d8.solid._4_4_,4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_178,(uint *)&local_1d8);
        paVar16 = (aiVector3t<double> *)
                  ((long)&((IfcVector3 *)
                          &(local_250.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar21);
        iVar6._M_current =
             (this_01->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this_01->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>const&>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this_01,iVar6,
                     paVar16);
        }
        else {
          (iVar6._M_current)->z = paVar16->z;
          dVar25 = paVar16->y;
          (iVar6._M_current)->x = paVar16->x;
          (iVar6._M_current)->y = dVar25;
          ppaVar1 = &(this_01->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        paVar16 = local_250.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar17;
        iVar6._M_current =
             (this_01->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this_01->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>const&>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this_01,iVar6,
                     paVar16);
        }
        else {
          (iVar6._M_current)->z = paVar16->z;
          dVar25 = paVar16->y;
          (iVar6._M_current)->x = paVar16->x;
          (iVar6._M_current)->y = dVar25;
          ppaVar1 = &(this_01->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1d8.solid =
             (IfcSolidModel *)
             (((IfcVector3 *)
              &local_250.
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17].x)->x + local_228.x);
        local_1d8.extrusionDir.x =
             local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar17].y + local_228.y;
        local_1d8.extrusionDir.y =
             local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar17].z + local_228.z;
        iVar6._M_current =
             (this_01->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this_01->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this_01,iVar6,
                     (aiVector3t<double> *)&local_1d8);
        }
        else {
          (iVar6._M_current)->z = local_1d8.extrusionDir.y;
          (iVar6._M_current)->x = (double)local_1d8.solid;
          (iVar6._M_current)->y = local_1d8.extrusionDir.x;
          ppaVar1 = &(this_01->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_1d8.solid =
             (IfcSolidModel *)
             (*(double *)
               ((long)&((IfcVector3 *)
                       &(local_250.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar21) + local_228.x);
        local_1d8.extrusionDir.x =
             *(double *)
              ((long)&(local_250.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y + lVar21) + local_228.y;
        local_1d8.extrusionDir.y =
             *(double *)
              ((long)&(local_250.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z + lVar21) + local_228.z;
        iVar6._M_current =
             (this_01->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this_01->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
          _M_realloc_insert<aiVector3t<double>>
                    ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this_01,iVar6,
                     (aiVector3t<double> *)&local_1d8);
        }
        else {
          (iVar6._M_current)->z = local_1d8.extrusionDir.y;
          (iVar6._M_current)->x = (double)local_1d8.solid;
          (iVar6._M_current)->y = local_1d8.extrusionDir.x;
          ppaVar1 = &(this_01->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        if (bVar23 != false) {
          dVar24 = *(double *)
                    ((long)&((IfcVector3 *)
                            &(local_250.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar21) -
                   ((IfcVector3 *)
                   &local_250.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17].x)->x;
          dVar26 = *(double *)
                    ((long)&(local_250.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->y + lVar21) -
                   local_250.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17].y;
          dVar25 = *(double *)
                    ((long)&(local_250.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->z + lVar21) -
                   local_250.
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17].z;
          dVar25 = dVar25 * dVar25 + dVar24 * dVar24 + dVar26 * dVar26;
          if (dVar25 < 0.0) {
            dVar25 = sqrt(dVar25);
          }
          else {
            dVar25 = SQRT(dVar25);
          }
          if (local_230 < dVar25) {
            bVar9 = GenerateOpenings(local_238->apply_openings,&local_1f8,&local_148,true,true,
                                     &local_228);
            local_208 = local_208 + (ulong)bVar9;
          }
          TempMesh::Append(local_200,&local_148);
          TempMesh::Clear(&local_148);
        }
        uVar14 = ((long)local_250.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_250.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar21 = lVar21 + 0x18;
      } while (uVar19 < uVar14);
      local_208 = CONCAT44(local_208._4_4_,(int)CONCAT71((int7)(uVar14 >> 8),local_208 == 1));
      result = local_200;
    }
    if (bVar23 != false) {
      pTVar3 = (local_238->apply_openings->
               super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar20 = (local_238->apply_openings->
                     super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                     )._M_impl.super__Vector_impl_data._M_start; pTVar20 != pTVar3;
          pTVar20 = pTVar20 + 1) {
        if ((pTVar20->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pTVar20->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5a450f);
        }
        paVar12 = (pTVar20->wallPoints).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pTVar20->wallPoints).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar12) {
          (pTVar20->wallPoints).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar12;
        }
      }
    }
    if ((char)local_110 == '\0') {
      bVar9 = false;
    }
    else {
      local_230 = 0.0;
      lVar21 = 0;
      do {
        if (lVar21 == 1) {
          if (local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar22 = 0x10;
            uVar14 = 0;
            do {
              local_1d8.solid =
                   (IfcSolidModel *)
                   (*(double *)
                     ((long)local_250.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar22 + -0x10) +
                   local_228.x);
              local_1d8.extrusionDir.x =
                   *(double *)
                    ((long)local_250.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8) + local_228.y;
              local_1d8.extrusionDir.y =
                   *(double *)
                    ((long)&((IfcVector3 *)
                            &(local_250.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x)->x + lVar22) +
                   local_228.z;
              iVar6._M_current =
                   (this_01->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this_01->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this_01,
                           iVar6,(aiVector3t<double> *)&local_1d8);
              }
              else {
                (iVar6._M_current)->z = local_1d8.extrusionDir.y;
                (iVar6._M_current)->x = (double)local_1d8.solid;
                (iVar6._M_current)->y = local_1d8.extrusionDir.x;
                ppaVar1 = &(this_01->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              uVar14 = uVar14 + 1;
              lVar22 = lVar22 + 0x18;
            } while (uVar14 < (ulong)(((long)local_250.
                                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_250.
                                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
        }
        else {
          lVar22 = (long)local_250.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_250.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar22 != 0) {
            lVar18 = (lVar22 >> 3) * -0x5555555555555555;
            do {
              paVar16 = (aiVector3t<double> *)
                        ((long)&((IfcVector3 *)
                                &local_250.
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].x)->x + lVar22);
              iVar6._M_current =
                   (this_01->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this_01->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)this_01,
                           iVar6,paVar16);
              }
              else {
                (iVar6._M_current)->z = paVar16->z;
                dVar25 = paVar16->y;
                (iVar6._M_current)->x = paVar16->x;
                (iVar6._M_current)->y = dVar25;
                ppaVar1 = &(this_01->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              lVar18 = lVar18 + -1;
              lVar22 = lVar22 + -0x18;
            } while (lVar18 != 0);
          }
        }
        local_1d8.solid =
             (IfcSolidModel *)
             CONCAT44(local_1d8.solid._4_4_,
                      (int)((ulong)((long)local_250.
                                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_250.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_178,(uint *)&local_1d8);
        if ((bVar23 != false) &&
           (2 < (ulong)(((long)local_250.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_250.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ))) {
          bVar9 = GenerateOpenings(local_238->apply_openings,&local_1f8,&local_148,true,true,
                                   &local_228);
          TempMesh::Append(local_200,&local_148);
          TempMesh::Clear(&local_148);
          local_230 = (double)((long)local_230 + (ulong)bVar9);
        }
        bVar9 = lVar21 == 0;
        lVar21 = lVar21 + 1;
      } while (bVar9);
      bVar9 = local_230 == 9.88131291682493e-324;
      result = local_200;
    }
    uVar8 = local_16c;
    if ((bVar23 & ((byte)local_208 | bVar9)) == 1) {
      LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5a475d);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5a4769);
    if (((char)uVar8 != '\0') &&
       (((result->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (result->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish ||
        ((result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish)))) {
      if (local_238->collect_openings ==
          (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0) {
        __assert_fail("conv.collect_openings",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCGeometry.cpp"
                      ,0x29b,
                      "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                     );
      }
      local_158 = (TempMesh *)operator_new(0x30);
      (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_158->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_158->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_158->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_158->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
                (&local_150,local_158);
      TempMesh::Swap(local_158,result);
      local_168 = (TempMesh *)operator_new(0x30);
      (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_168->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_168->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_168->mVerts).
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::TempMesh*>
                (&local_160,local_168);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_168,
                 (local_168->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_250.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_250.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      local_1d8.solid =
           (IfcSolidModel *)
           CONCAT44(local_1d8.solid._4_4_,
                    (int)((ulong)((long)local_250.
                                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_250.
                                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&local_168->mVertcnt,(uint *)&local_1d8);
      this_00._M_pi = local_150._M_pi;
      this._M_pi = local_160._M_pi;
      pvVar2 = local_238->collect_openings;
      local_88 = local_228.x;
      dStack_80 = local_228.y;
      local_78 = local_228.z;
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        }
      }
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        }
      }
      local_1d8.extrusionDir.z = local_228.z;
      local_1d8.extrusionDir.x = local_228.x;
      local_1d8.extrusionDir.y = local_228.y;
      local_1d8.solid = (IfcSolidModel *)local_118;
      local_1d8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_158;
      local_1d8.profileMesh.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_150._M_pi;
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        }
      }
      local_1d8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_168;
      local_1d8.profileMesh2D.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_160._M_pi;
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        }
      }
      local_1d8.wallPoints.
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.wallPoints.
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.wallPoints.
      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
      emplace_back<Assimp::IFC::TempOpening>(pvVar2,&local_1d8);
      if (local_1d8.wallPoints.
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d8.wallPoints.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d8.wallPoints.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.wallPoints.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1d8.profileMesh2D.
          super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.profileMesh2D.
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1d8.profileMesh.
          super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.profileMesh.
                   super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if (((result->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (result->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         ((result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start !=
          (result->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish)) {
        __assert_fail("result.IsEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCGeometry.cpp"
                      ,0x2a4,
                      "void Assimp::IFC::ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid &, const TempMesh &, const IfcVector3 &, TempMesh &, ConversionData &, bool)"
                     );
      }
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
      }
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
      }
    }
    if (local_148.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.mVertcnt.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.mVertcnt.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.mVertcnt.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_148.mVerts.
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.mVerts.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.mVerts.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.mVerts.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_250.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (IfcVector3 *)0x0) {
      operator_delete(local_250.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else if ((char)local_110 != '\0') {
    TempMesh::Append(result,curve);
    return;
  }
  return;
}

Assistant:

void ProcessExtrudedArea(const Schema_2x3::IfcExtrudedAreaSolid& solid, const TempMesh& curve,
    const IfcVector3& extrusionDir, TempMesh& result, ConversionData &conv, bool collect_openings)
{
    // Outline: 'curve' is now a list of vertex points forming the underlying profile, extrude along the given axis,
    // forming new triangles.
    const bool has_area = solid.SweptArea->ProfileType == "AREA" && curve.mVerts.size() > 2;
    if( solid.Depth < 1e-6 ) {
        if( has_area ) {
            result.Append(curve);
        }
        return;
    }

    result.mVerts.reserve(curve.mVerts.size()*(has_area ? 4 : 2));
    result.mVertcnt.reserve(curve.mVerts.size() + 2);
    std::vector<IfcVector3> in = curve.mVerts;

    // First step: transform all vertices into the target coordinate space
    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);
    for(IfcVector3& v : in) {
        v *= trafo;

        vmin = std::min(vmin, v);
        vmax = std::max(vmax, v);
    }

    vmax -= vmin;
    const IfcFloat diag = vmax.Length();
    IfcVector3 dir = IfcMatrix3(trafo) * extrusionDir;

    // reverse profile polygon if it's winded in the wrong direction in relation to the extrusion direction
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(in.data(), in.size());
    if( profileNormal * dir < 0.0 )
        std::reverse(in.begin(), in.end());

    std::vector<IfcVector3> nors;
    const bool openings = !!conv.apply_openings && conv.apply_openings->size();

    // Compute the normal vectors for all opening polygons as a prerequisite
    // to TryAddOpenings_Poly2Tri()
    // XXX this belongs into the aforementioned function
    if( openings ) {

        if( !conv.settings.useCustomTriangulation ) {
            // it is essential to apply the openings in the correct spatial order. The direction
            // doesn't matter, but we would screw up if we started with e.g. a door in between
            // two windows.
            std::sort(conv.apply_openings->begin(), conv.apply_openings->end(), TempOpening::DistanceSorter(in[0]));
        }

        nors.reserve(conv.apply_openings->size());
        for(TempOpening& t : *conv.apply_openings) {
            TempMesh& bounds = *t.profileMesh.get();

            if( bounds.mVerts.size() <= 2 ) {
                nors.push_back(IfcVector3());
                continue;
            }
            nors.push_back(((bounds.mVerts[2] - bounds.mVerts[0]) ^ (bounds.mVerts[1] - bounds.mVerts[0])).Normalize());
        }
    }


    TempMesh temp;
    TempMesh& curmesh = openings ? temp : result;
    std::vector<IfcVector3>& out = curmesh.mVerts;

    size_t sides_with_openings = 0;
    for( size_t i = 0; i < in.size(); ++i ) {
        const size_t next = (i + 1) % in.size();

        curmesh.mVertcnt.push_back(4);

        out.push_back(in[i]);
        out.push_back(in[next]);
        out.push_back(in[next] + dir);
        out.push_back(in[i] + dir);

        if( openings ) {
            if( (in[i] - in[next]).Length() > diag * 0.1 && GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                ++sides_with_openings;
            }

            result.Append(temp);
            temp.Clear();
        }
    }

    if( openings ) {
        for(TempOpening& opening : *conv.apply_openings) {
            if( !opening.wallPoints.empty() ) {
                IFCImporter::LogError("failed to generate all window caps");
            }
            opening.wallPoints.clear();
        }
    }

    size_t sides_with_v_openings = 0;
    if( has_area ) {

        for( size_t n = 0; n < 2; ++n ) {
            if( n > 0 ) {
                for( size_t i = 0; i < in.size(); ++i )
                    out.push_back(in[i] + dir);
            }
            else {
                for( size_t i = in.size(); i--; )
                    out.push_back(in[i]);
            }

            curmesh.mVertcnt.push_back(static_cast<unsigned int>(in.size()));
            if( openings && in.size() > 2 ) {
                if( GenerateOpenings(*conv.apply_openings, nors, temp, true, true, dir) ) {
                    ++sides_with_v_openings;
                }

                result.Append(temp);
                temp.Clear();
            }
        }
    }

    if( openings && ((sides_with_openings == 1 && sides_with_openings) || (sides_with_v_openings == 2 && sides_with_v_openings)) ) {
        IFCImporter::LogWarn("failed to resolve all openings, presumably their topology is not supported by Assimp");
    }

    IFCImporter::LogDebug("generate mesh procedurally by extrusion (IfcExtrudedAreaSolid)");

    // If this is an opening element, store both the extruded mesh and the 2D profile mesh
    // it was created from. Return an empty mesh to the caller.
    if( collect_openings && !result.IsEmpty() ) {
        ai_assert(conv.collect_openings);
        std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
        profile->Swap(result);

        std::shared_ptr<TempMesh> profile2D = std::shared_ptr<TempMesh>(new TempMesh());
        profile2D->mVerts.insert(profile2D->mVerts.end(), in.begin(), in.end());
        profile2D->mVertcnt.push_back(static_cast<unsigned int>(in.size()));
        conv.collect_openings->push_back(TempOpening(&solid, dir, profile, profile2D));

        ai_assert(result.IsEmpty());
    }
}